

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O1

string * EncodeHex_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> in)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (in.size_ != 0) {
    sVar1 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar1 = sVar1 + 1;
    } while (in.size_ != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeHex(bssl::Span<const uint8_t> in) {
  static const char kHexDigits[] = "0123456789abcdef";
  std::string ret;
  ret.reserve(in.size() * 2);
  for (uint8_t b : in) {
    ret += kHexDigits[b >> 4];
    ret += kHexDigits[b & 0xf];
  }
  return ret;
}